

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O0

void bssl::ssl_send_alert(SSL *ssl,int level,int desc)

{
  ERR_SAVE_STATE *__p;
  pointer state;
  unique_ptr<err_save_state_st,_bssl::internal::Deleter> local_20;
  UniquePtr<ERR_SAVE_STATE> err_state;
  int desc_local;
  int level_local;
  SSL *ssl_local;
  
  err_state._M_t.super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl._0_4_ = desc;
  err_state._M_t.super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl._4_4_ = level;
  __p = ERR_save_state();
  std::unique_ptr<err_save_state_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<err_save_state_st,bssl::internal::Deleter> *)&local_20,__p);
  ssl_send_alert_impl(ssl,err_state._M_t.
                          super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl._4_4_,
                      (int)err_state._M_t.
                           super___uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl);
  state = std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::get(&local_20);
  ERR_restore_state(state);
  std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return;
}

Assistant:

void ssl_send_alert(SSL *ssl, int level, int desc) {
  // This function is called in response to a fatal error from the peer. Ignore
  // any failures writing the alert and report only the original error. In
  // particular, if the transport uses |SSL_write|, our existing error will be
  // clobbered so we must save and restore the error queue. See
  // https://crbug.com/959305.
  //
  // TODO(davidben): Return the alert out of the handshake, rather than calling
  // this function internally everywhere.
  //
  // TODO(davidben): This does not allow retrying if the alert hit EAGAIN. See
  // https://crbug.com/boringssl/130.
  UniquePtr<ERR_SAVE_STATE> err_state(ERR_save_state());
  ssl_send_alert_impl(ssl, level, desc);
  ERR_restore_state(err_state.get());
}